

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O3

Tail njoy::ENDFtk::record::skip<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *end,long *lineNumber)

{
  array<int,_3UL> aVar1;
  long *local_38 [2];
  long local_28 [2];
  
  Base<njoy::ENDFtk::record::Character<66>>::
  Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((Base<njoy::ENDFtk::record::Character<66>> *)local_38,begin,end);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  aVar1 = Tail::read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end);
  *lineNumber = *lineNumber + 1;
  return (array<int,_3UL>)(array<int,_3UL>)aVar1._M_elems;
}

Assistant:

Tail skip( Iterator& begin, const Iterator& end, long& lineNumber ){
    try{
      Base< Character< 66 > >( begin, end );
    } catch( std::exception& e ){
      Log::info( "Error while skipping a record." );
      throw e;
    }
    return Tail( begin, end, lineNumber );
  }